

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# version_set.cc
# Opt level: O3

int64_t __thiscall leveldb::VersionSet::MaxNextLevelOverlappingBytes(VersionSet *this)

{
  long lVar1;
  Version *this_00;
  pointer ppFVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  ulong uVar6;
  pointer ppFVar7;
  long lVar8;
  long lVar9;
  long in_FS_OFFSET;
  vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_> overlaps;
  vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_58.super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_58.super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_58.super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this_00 = this->current_;
  ppFVar7 = (pointer)0x0;
  lVar5 = 0;
  lVar8 = 1;
  do {
    ppFVar2 = this_00->files_[lVar8].
              super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    lVar9 = lVar8 + 1;
    if (this_00->files_[lVar8].
        super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>.
        _M_impl.super__Vector_impl_data._M_finish != ppFVar2) {
      uVar6 = 0;
      do {
        Version::GetOverlappingInputs
                  (this_00,(int)lVar9,&ppFVar2[uVar6]->smallest,&ppFVar2[uVar6]->largest,&local_58);
        if ((long)local_58.
                  super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)local_58.
                  super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                  ._M_impl.super__Vector_impl_data._M_start == 0) {
          lVar3 = 0;
        }
        else {
          lVar1 = (long)local_58.
                        super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)local_58.
                        super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 3;
          lVar4 = 0;
          lVar3 = 0;
          do {
            lVar3 = lVar3 + local_58.
                            super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                            ._M_impl.super__Vector_impl_data._M_start[lVar4]->file_size;
            lVar4 = lVar4 + 1;
          } while (lVar1 + (ulong)(lVar1 == 0) != lVar4);
        }
        if (lVar5 < lVar3) {
          lVar5 = lVar3;
        }
        uVar6 = uVar6 + 1;
        this_00 = this->current_;
        ppFVar2 = this_00->files_[lVar8].
                  super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        ppFVar7 = local_58.
                  super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                  ._M_impl.super__Vector_impl_data._M_start;
      } while (uVar6 < (ulong)((long)this_00->files_[lVar8].
                                     super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                                     ._M_impl.super__Vector_impl_data._M_finish - (long)ppFVar2 >> 3
                              ));
    }
    lVar8 = lVar9;
  } while (lVar9 != 6);
  if (ppFVar7 != (pointer)0x0) {
    operator_delete(ppFVar7,(long)local_58.
                                  super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppFVar7
                   );
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return lVar5;
}

Assistant:

int64_t VersionSet::MaxNextLevelOverlappingBytes() {
  int64_t result = 0;
  std::vector<FileMetaData*> overlaps;
  for (int level = 1; level < config::kNumLevels - 1; level++) {
    for (size_t i = 0; i < current_->files_[level].size(); i++) {
      const FileMetaData* f = current_->files_[level][i];
      current_->GetOverlappingInputs(level + 1, &f->smallest, &f->largest,
                                     &overlaps);
      const int64_t sum = TotalFileSize(overlaps);
      if (sum > result) {
        result = sum;
      }
    }
  }
  return result;
}